

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<9,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  VecAccess<float,_4,_3> local_60;
  Vector<float,_3> local_34;
  undefined1 local_28 [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[1].m_data[0] = (float)in1Type;
  in0.m_data.m_data[1].m_data[1] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((MatrixCaseUtils *)local_28,evalCtx,0);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,5>
              ((MatrixCaseUtils *)local_28,evalCtx,0);
  }
  reduceToVec3((MatrixCaseUtils *)&local_34,(Mat2 *)local_28);
  tcu::Vector<float,_4>::xyz(&local_60,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_60,&local_34);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_28);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}